

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::ReflectionOps::DiscardUnknownFields(Message *message)

{
  FieldDescriptor *this;
  pointer ppFVar1;
  bool bVar2;
  CppType CVar3;
  int iVar4;
  Reflection *this_00;
  UnknownFieldSet *this_01;
  Descriptor *pDVar5;
  MapFieldBase *this_02;
  Message *pMVar6;
  pointer ppFVar7;
  int index;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_d8;
  MapIterator local_c0;
  MapIterator local_78;
  
  this_00 = GetReflectionOrDie(message);
  this_01 = Reflection::MutableUnknownFields(this_00,message);
  UnknownFieldSet::Clear(this_01);
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields
            (this_00,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&local_d8);
  ppFVar1 = local_d8._M_impl.super__Vector_impl_data._M_finish;
  ppFVar7 = local_d8._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppFVar7 == ppFVar1) {
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base(&local_d8);
      return;
    }
    this = *ppFVar7;
    CVar3 = FieldDescriptor::cpp_type(this);
    if (CVar3 == CPPTYPE_MESSAGE) {
      bVar2 = FieldDescriptor::is_map(this);
      if (bVar2) {
        pDVar5 = FieldDescriptor::message_type(this);
        CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)(*(long *)(pDVar5 + 0x28) + 0x48));
        if (CVar3 == CPPTYPE_MESSAGE) {
          this_02 = Reflection::MutableMapData(this_00,message,this);
          bVar2 = MapFieldBase::IsMapValid(this_02);
          if (bVar2) {
            MapIterator::MapIterator(&local_c0,message,this);
            MapIterator::MapIterator(&local_78,message,this);
            (*this_02->_vptr_MapFieldBase[7])(this_02,&local_c0);
            (*this_02->_vptr_MapFieldBase[8])(this_02,&local_78);
            while( true ) {
              iVar4 = (*(local_c0.map_)->_vptr_MapFieldBase[6])(local_c0.map_,&local_c0,&local_78);
              if ((char)iVar4 != '\0') break;
              MapFieldBase::SetMapDirty(local_c0.map_);
              pMVar6 = MapValueRef::MutableMessageValue(&local_c0.value_);
              Message::DiscardUnknownFields(pMVar6);
              (*(local_c0.map_)->_vptr_MapFieldBase[0x14])(local_c0.map_,&local_c0);
            }
            MapIterator::~MapIterator(&local_78);
            MapIterator::~MapIterator(&local_c0);
          }
          goto LAB_003aa0b4;
        }
      }
      if ((~(byte)this[1] & 0x60) == 0) {
        iVar4 = Reflection::FieldSize(this_00,message,this);
        index = 0;
        if (iVar4 < 1) {
          iVar4 = index;
        }
        for (; iVar4 != index; index = index + 1) {
          pMVar6 = Reflection::MutableRepeatedMessage(this_00,message,this,index);
          Message::DiscardUnknownFields(pMVar6);
        }
      }
      else {
        pMVar6 = Reflection::MutableMessage(this_00,message,this,(MessageFactory *)0x0);
        Message::DiscardUnknownFields(pMVar6);
      }
    }
LAB_003aa0b4:
    ppFVar7 = ppFVar7 + 1;
  } while( true );
}

Assistant:

void ReflectionOps::DiscardUnknownFields(Message* message) {
  const Reflection* reflection = GetReflectionOrDie(*message);

  reflection->MutableUnknownFields(message)->Clear();

  // Walk through the fields of this message and DiscardUnknownFields on any
  // messages present.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (const FieldDescriptor* field : fields) {
    // Skip over non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
      continue;
    }
    // Discard the unknown fields in maps that contain message values.
    if (field->is_map() && IsMapValueMessageTyped(field)) {
      const MapFieldBase* map_field =
          reflection->MutableMapData(message, field);
      if (map_field->IsMapValid()) {
        MapIterator iter(message, field);
        MapIterator end(message, field);
        for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
             ++iter) {
          iter.MutableValueRef()->MutableMessageValue()->DiscardUnknownFields();
        }
      }
      // Discard every unknown field inside messages in a repeated field.
    } else if (field->is_repeated()) {
      int size = reflection->FieldSize(*message, field);
      for (int j = 0; j < size; j++) {
        reflection->MutableRepeatedMessage(message, field, j)
            ->DiscardUnknownFields();
      }
      // Discard the unknown fields inside an optional message.
    } else {
      reflection->MutableMessage(message, field)->DiscardUnknownFields();
    }
  }
}